

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostStepRegistry.cpp
# Opt level: O1

void Assimp::GetPostProcessingStepInstanceList
               (vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_> *out)

{
  pointer *pppBVar1;
  iterator iVar2;
  OptimizeGraphProcess *pOVar3;
  OptimizeGraphProcess *local_18;
  
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::reserve(out,0x1f);
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x28);
  RemoveVCProcess::RemoveVCProcess((RemoveVCProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x38);
  RemoveRedundantMatsProcess::RemoveRedundantMatsProcess((RemoveRedundantMatsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x38);
  EmbedTexturesProcess::EmbedTexturesProcess((EmbedTexturesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  FindInstancesProcess::FindInstancesProcess((FindInstancesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x90);
  OptimizeGraphProcess::OptimizeGraphProcess(pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  ComputeUVMappingProcess::ComputeUVMappingProcess((ComputeUVMappingProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  TextureTransformStep::TextureTransformStep((TextureTransformStep *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  ScaleProcess::ScaleProcess((ScaleProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x60);
  PretransformVertices::PretransformVertices((PretransformVertices *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  TriangulateProcess::TriangulateProcess((TriangulateProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  FindDegeneratesProcess::FindDegeneratesProcess((FindDegeneratesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  SortByPTypeProcess::SortByPTypeProcess((SortByPTypeProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  FindInvalidDataProcess::FindInvalidDataProcess((FindInvalidDataProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x78);
  OptimizeMeshesProcess::OptimizeMeshesProcess((OptimizeMeshesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  FixInfacingNormalsProcess::FixInfacingNormalsProcess((FixInfacingNormalsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x38);
  SplitByBoneCountProcess::SplitByBoneCountProcess((SplitByBoneCountProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle
            ((SplitLargeMeshesProcess_Triangle *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  DropFaceNormalsProcess::DropFaceNormalsProcess((DropFaceNormalsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  GenFaceNormalsProcess::GenFaceNormalsProcess((GenFaceNormalsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  (pOVar3->super_BaseProcess)._vptr_BaseProcess = (_func_int **)0x0;
  (pOVar3->super_BaseProcess).shared = (SharedPostProcessInfo *)0x0;
  (pOVar3->super_BaseProcess).progress = (ProgressHandler *)0x0;
  BaseProcess::BaseProcess((BaseProcess *)pOVar3);
  (pOVar3->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__BaseProcess_009dbd90;
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  GenVertexNormalsProcess::GenVertexNormalsProcess((GenVertexNormalsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  CalcTangentsProcess::CalcTangentsProcess((CalcTangentsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  JoinVerticesProcess::JoinVerticesProcess((JoinVerticesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  (pOVar3->super_BaseProcess)._vptr_BaseProcess = (_func_int **)0x0;
  (pOVar3->super_BaseProcess).shared = (SharedPostProcessInfo *)0x0;
  (pOVar3->super_BaseProcess).progress = (ProgressHandler *)0x0;
  BaseProcess::BaseProcess((BaseProcess *)pOVar3);
  (pOVar3->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__BaseProcess_009dbe20;
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex
            ((SplitLargeMeshesProcess_Vertex *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x40);
  DeboneProcess::DeboneProcess((DeboneProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  LimitBoneWeightsProcess::LimitBoneWeightsProcess((LimitBoneWeightsProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x20);
  ImproveCacheLocalityProcess::ImproveCacheLocalityProcess((ImproveCacheLocalityProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_18 = pOVar3;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  pOVar3 = (OptimizeGraphProcess *)operator_new(0x18);
  GenBoundingBoxesProcess::GenBoundingBoxesProcess((GenBoundingBoxesProcess *)pOVar3);
  iVar2._M_current =
       (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = pOVar3;
    std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
    _M_realloc_insert<Assimp::BaseProcess*>
              ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)out,iVar2,
               (BaseProcess **)&local_18);
  }
  else {
    *iVar2._M_current = (BaseProcess *)pOVar3;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void GetPostProcessingStepInstanceList(std::vector< BaseProcess* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each post processing step here in the order
    // of sequence it is executed. Steps that are added here are not
    // validated - as RegisterPPStep() does - all dependencies must be given.
    // ----------------------------------------------------------------------------
    out.reserve(31);
#if (!defined ASSIMP_BUILD_NO_MAKELEFTHANDED_PROCESS)
    out.push_back( new MakeLeftHandedProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FLIPUVS_PROCESS)
    out.push_back( new FlipUVsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FLIPWINDINGORDER_PROCESS)
    out.push_back( new FlipWindingOrderProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_REMOVEVC_PROCESS)
    out.push_back( new RemoveVCProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_REMOVE_REDUNDANTMATERIALS_PROCESS)
    out.push_back( new RemoveRedundantMatsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_EMBEDTEXTURES_PROCESS)
    out.push_back( new EmbedTexturesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDINSTANCES_PROCESS)
    out.push_back( new FindInstancesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_OPTIMIZEGRAPH_PROCESS)
    out.push_back( new OptimizeGraphProcess());
#endif
#ifndef ASSIMP_BUILD_NO_GENUVCOORDS_PROCESS
    out.push_back( new ComputeUVMappingProcess());
#endif
#ifndef ASSIMP_BUILD_NO_TRANSFORMTEXCOORDS_PROCESS
    out.push_back( new TextureTransformStep());
#endif
#if (!defined ASSIMP_BUILD_NO_GLOBALSCALE_PROCESS)
    out.push_back( new ScaleProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_PRETRANSFORMVERTICES_PROCESS)
    out.push_back( new PretransformVertices());
#endif
#if (!defined ASSIMP_BUILD_NO_TRIANGULATE_PROCESS)
    out.push_back( new TriangulateProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDDEGENERATES_PROCESS)
    //find degenerates should run after triangulation (to sort out small
    //generated triangles) but before sort by p types (in case there are lines
    //and points generated and inserted into a mesh)
    out.push_back( new FindDegeneratesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SORTBYPTYPE_PROCESS)
    out.push_back( new SortByPTypeProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDINVALIDDATA_PROCESS)
    out.push_back( new FindInvalidDataProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_OPTIMIZEMESHES_PROCESS)
    out.push_back( new OptimizeMeshesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FIXINFACINGNORMALS_PROCESS)
    out.push_back( new FixInfacingNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SPLITBYBONECOUNT_PROCESS)
    out.push_back( new SplitByBoneCountProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SPLITLARGEMESHES_PROCESS)
    out.push_back( new SplitLargeMeshesProcess_Triangle());
#endif
#if (!defined ASSIMP_BUILD_NO_GENFACENORMALS_PROCESS)
    out.push_back( new DropFaceNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_GENFACENORMALS_PROCESS)
    out.push_back( new GenFaceNormalsProcess());
#endif
    // .........................................................................
    // DON'T change the order of these five ..
    // XXX this is actually a design weakness that dates back to the time
    // when Importer would maintain the postprocessing step list exclusively.
    // Now that others access it too, we need a better solution.
    out.push_back( new ComputeSpatialSortProcess());
    // .........................................................................

#if (!defined ASSIMP_BUILD_NO_GENVERTEXNORMALS_PROCESS)
    out.push_back( new GenVertexNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_CALCTANGENTS_PROCESS)
    out.push_back( new CalcTangentsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_JOINVERTICES_PROCESS)
    out.push_back( new JoinVerticesProcess());
#endif

    // .........................................................................
    out.push_back( new DestroySpatialSortProcess());
    // .........................................................................

#if (!defined ASSIMP_BUILD_NO_SPLITLARGEMESHES_PROCESS)
    out.push_back( new SplitLargeMeshesProcess_Vertex());
#endif
#if (!defined ASSIMP_BUILD_NO_DEBONE_PROCESS)
    out.push_back( new DeboneProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_LIMITBONEWEIGHTS_PROCESS)
    out.push_back( new LimitBoneWeightsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_IMPROVECACHELOCALITY_PROCESS)
    out.push_back( new ImproveCacheLocalityProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_GENBOUNDINGBOXES_PROCESS)
    out.push_back(new GenBoundingBoxesProcess);
#endif
}